

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Shutdown(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiIniData> *this_00;
  ImFontAtlas *this_01;
  FILE *__stream;
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  value_type *pvVar3;
  long lVar4;
  int i;
  int iVar5;
  
  pIVar1 = GImGui;
  this_01 = (GImGui->IO).Fonts;
  if (this_01 != (ImFontAtlas *)0x0) {
    ImFontAtlas::Clear(this_01);
  }
  if (pIVar1->Initialized == true) {
    SaveIniSettingsToDisk((pIVar1->IO).IniFilename);
    this = &pIVar1->Windows;
    for (iVar5 = 0; iVar5 < this->Size; iVar5 = iVar5 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,iVar5);
      ImGuiWindow::~ImGuiWindow(*ppIVar2);
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,iVar5);
      MemFree(*ppIVar2);
    }
    ImVector<ImGuiWindow_*>::clear(this);
    ImVector<ImGuiWindow_*>::clear(&pIVar1->WindowsSortBuffer);
    pIVar1->CurrentWindow = (ImGuiWindow *)0x0;
    ImVector<ImGuiWindow_*>::clear(&pIVar1->CurrentWindowStack);
    this_00 = &pIVar1->Settings;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->NavWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar1->MovedWindow = (ImGuiWindow *)0x0;
    for (iVar5 = 0; iVar5 < this_00->Size; iVar5 = iVar5 + 1) {
      pvVar3 = ImVector<ImGuiIniData>::operator[](this_00,iVar5);
      MemFree(pvVar3->Name);
    }
    ImVector<ImGuiIniData>::clear(this_00);
    ImVector<ImGuiColMod>::clear(&pIVar1->ColorModifiers);
    ImVector<ImGuiStyleMod>::clear(&pIVar1->StyleModifiers);
    ImVector<ImFont_*>::clear(&pIVar1->FontStack);
    ImVector<ImGuiPopupRef>::clear(&pIVar1->OpenPopupStack);
    ImVector<ImGuiPopupRef>::clear(&pIVar1->CurrentPopupStack);
    pIVar1->SetNextWindowSizeConstraintCallback = (ImGuiSizeConstraintCallback)0x0;
    pIVar1->SetNextWindowSizeConstraintCallbackUserData = (void *)0x0;
    for (lVar4 = 0x18c0; lVar4 != 0x18f0; lVar4 = lVar4 + 0x10) {
      ImVector<ImDrawList_*>::clear
                ((ImVector<ImDrawList_*> *)((long)(pIVar1->IO).KeyMap + lVar4 + -0x34));
    }
    ImDrawList::ClearFreeMemory(&pIVar1->OverlayDrawList);
    ImVector<char>::clear(&pIVar1->PrivateClipboard);
    ImVector<unsigned_short>::clear(&(pIVar1->InputTextState).Text);
    ImVector<char>::clear(&(pIVar1->InputTextState).InitialText);
    ImVector<char>::clear(&(pIVar1->InputTextState).TempTextBuffer);
    __stream = (FILE *)pIVar1->LogFile;
    if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
      fclose(__stream);
      pIVar1->LogFile = (FILE *)0x0;
    }
    if (&pIVar1->LogClipboard->Buf != (ImVector<char> *)0x0) {
      ImVector<char>::~ImVector(&pIVar1->LogClipboard->Buf);
      MemFree(pIVar1->LogClipboard);
    }
    pIVar1->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown()
{
    ImGuiContext& g = *GImGui;

    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    if (g.IO.Fonts) // Testing for NULL to allow user to NULLify in case of running Shutdown() on multiple contexts. Bit hacky.
        g.IO.Fonts->Clear();

    // Cleanup of other data are conditional on actually having initialize ImGui.
    if (!g.Initialized)
        return;

    SaveIniSettingsToDisk(g.IO.IniFilename);

    for (int i = 0; i < g.Windows.Size; i++)
    {
        g.Windows[i]->~ImGuiWindow();
        ImGui::MemFree(g.Windows[i]);
    }
    g.Windows.clear();
    g.WindowsSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.NavWindow = NULL;
    g.HoveredWindow = NULL;
    g.HoveredRootWindow = NULL;
    g.ActiveIdWindow = NULL;
    g.MovedWindow = NULL;
    for (int i = 0; i < g.Settings.Size; i++)
        ImGui::MemFree(g.Settings[i].Name);
    g.Settings.clear();
    g.ColorModifiers.clear();
    g.StyleModifiers.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.CurrentPopupStack.clear();
    g.SetNextWindowSizeConstraintCallback = NULL;
    g.SetNextWindowSizeConstraintCallbackUserData = NULL;
    for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        g.RenderDrawLists[i].clear();
    g.OverlayDrawList.ClearFreeMemory();
    g.PrivateClipboard.clear();
    g.InputTextState.Text.clear();
    g.InputTextState.InitialText.clear();
    g.InputTextState.TempTextBuffer.clear();

    if (g.LogFile && g.LogFile != stdout)
    {
        fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard)
    {
        g.LogClipboard->~ImGuiTextBuffer();
        ImGui::MemFree(g.LogClipboard);
    }

    g.Initialized = false;
}